

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfold.cpp
# Opt level: O2

int __thiscall ncnn::Unfold::forward(Unfold *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  undefined4 *puVar19;
  int i;
  int iVar20;
  undefined4 *puVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  Mat local_c8;
  Option opt_b;
  
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  opt_b.lightmode = opt->lightmode;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_ops = opt->use_subgroup_ops;
  opt_b.use_reserved_0 = opt->use_reserved_0;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  uVar14._0_1_ = opt->use_bf16_storage;
  uVar14._1_1_ = opt->use_fp16_packed;
  uVar14._2_1_ = opt->use_fp16_storage;
  uVar14._3_1_ = opt->use_fp16_arithmetic;
  uVar14._4_1_ = opt->use_int8_packed;
  uVar14._5_1_ = opt->use_int8_storage;
  uVar14._6_1_ = opt->use_int8_arithmetic;
  uVar14._7_1_ = opt->use_packing_layout;
  opt_b.vulkan_device_index = opt->vulkan_device_index;
  opt_b.use_reserved_1 = opt->use_reserved_1;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_reserved_2 = opt->use_reserved_2;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_shader_local_memory = opt->use_shader_local_memory;
  opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  opt_b.use_fp16_uniform = opt->use_fp16_uniform;
  opt_b.use_int8_uniform = opt->use_int8_uniform;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  opt_b._32_8_ = uVar14 & 0xffffffffffffff;
  make_padding(this,bottom_blob,&local_c8,&opt_b);
  iVar11 = local_c8.w;
  iVar13 = -100;
  if (local_c8.data != (void *)0x0) {
    iVar24 = local_c8.c;
    if (local_c8.cstep * (long)local_c8.c != 0) {
      iVar8 = (~((this->kernel_w + -1) * this->dilation_w) + local_c8.w) / this->stride_w;
      iVar9 = (~((this->kernel_h + -1) * this->dilation_h) + local_c8.h) / this->stride_h;
      iVar12 = iVar8 + 1;
      iVar23 = this->kernel_h * this->kernel_w;
      Mat::create(top_blob,(iVar9 + 1) * iVar12,iVar23 * local_c8.c,
                  CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize),
                  opt->blob_allocator);
      pvVar6 = top_blob->data;
      if (pvVar6 == (void *)0x0) {
        iVar13 = -100;
      }
      else {
        iVar13 = -100;
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar13 = this->stride_h;
          iVar1 = this->stride_w;
          iVar2 = top_blob->w;
          sVar7 = top_blob->elemsize;
          iVar16 = this->kernel_h;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          uVar14 = (ulong)(uint)iVar24;
          if (iVar24 < 1) {
            uVar14 = 0;
          }
          for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
            puVar21 = (undefined4 *)(uVar22 * (long)iVar23 * (long)iVar2 * sVar7 + (long)pvVar6);
            iVar24 = 0;
            uVar15 = (ulong)(uint)this->kernel_w;
            if (this->kernel_w < 1) {
              uVar15 = 0;
            }
            for (; iVar24 != iVar16; iVar24 = iVar24 + 1) {
              iVar3 = this->dilation_h;
              iVar4 = this->dilation_w;
              for (uVar18 = 0; uVar18 != uVar15; uVar18 = uVar18 + 1) {
                puVar19 = (undefined4 *)
                          ((long)local_c8.data +
                          uVar18 * (long)iVar4 * 4 +
                          (long)iVar24 * (long)iVar3 *
                          (long)local_c8.w *
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) +
                          local_c8.cstep *
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * uVar22);
                for (iVar20 = 0; iVar20 <= iVar9; iVar20 = iVar20 + 1) {
                  iVar5 = this->stride_w;
                  for (iVar17 = 0; iVar17 <= iVar8; iVar17 = iVar17 + 1) {
                    *puVar21 = *puVar19;
                    puVar21 = puVar21 + 1;
                    puVar19 = puVar19 + iVar5;
                  }
                  puVar19 = puVar19 + ((long)(iVar11 * iVar13) - (long)(iVar12 * iVar1));
                }
              }
            }
          }
          iVar13 = 0;
        }
      }
    }
  }
  piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar13;
}

Assistant:

int Unfold::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        opt_b.use_packing_layout = false;
        make_padding(bottom_blob, bottom_blob_bordered, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;
    }

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const int channels = bottom_blob_bordered.c;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    const int size = outw * outh;
    const int maxk = kernel_w * kernel_h;

    top_blob.create(size, maxk * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // im2col
    const int gap = w * stride_h - outw * stride_w;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const Mat img = bottom_blob_bordered.channel(p);
        float* ptr = top_blob.row(p * maxk);

        for (int u = 0; u < kernel_h; u++)
        {
            for (int v = 0; v < kernel_w; v++)
            {
                const float* sptr = img.row(dilation_h * u) + dilation_w * v;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        ptr[0] = sptr[0];

                        sptr += stride_w;
                        ptr += 1;
                    }

                    sptr += gap;
                }
            }
        }
    }

    return 0;
}